

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::samplers::Sampler_testSamplerTags_Test::TestBody(Sampler_testSamplerTags_Test *this)

{
  long *plVar1;
  pointer pTVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char **rhs;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  *this_00;
  char *pcVar6;
  pointer pTVar7;
  long lVar8;
  AssertionResult gtest_ar_;
  int count;
  AssertionResult gtest_ar;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> tags;
  ConstSampler constFalse;
  ConstSampler constTrue;
  anon_struct_80_3_42a5a058 tests [4];
  ProbabilisticSampler prob;
  RateLimitingSampler rate;
  long *local_2f8;
  undefined8 uStack_2f0;
  long *local_2e8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  long local_2d8 [2];
  int local_2c4;
  undefined1 local_2c0 [16];
  char local_2b0 [16];
  long local_2a0;
  vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> local_298;
  Value *local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_278;
  AssertHelper local_270 [8];
  ConstSampler local_268;
  ConstSampler local_240;
  ConstSampler *local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_1f0;
  ConstSampler *local_1c8;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_1a0;
  ProbabilisticSampler *local_178;
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_150;
  RateLimitingSampler *local_128;
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
  local_100;
  ProbabilisticSampler local_d0;
  RateLimitingSampler local_a0;
  
  ConstSampler::ConstSampler(&local_240,true);
  ConstSampler::ConstSampler(&local_268,false);
  ProbabilisticSampler::ProbabilisticSampler(&local_d0,0.1);
  RateLimitingSampler::RateLimitingSampler(&local_a0,0.1);
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_218 = &local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"const","");
  local_2c0[0] = (internal)0x1;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<bool&,opentracing::v3::util::detail::value_traits<bool&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_1f0,(bool *)local_2c0);
  local_1c0[0] = local_1b0;
  local_1c8 = &local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"const","");
  local_2c0._0_8_ = (ulong)(uint7)local_2c0._1_7_ << 8;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<bool&,opentracing::v3::util::detail::value_traits<bool&,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_1a0,(bool *)local_2c0);
  local_170[0] = local_160;
  local_178 = &local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"probabilistic","");
  local_2c0._0_8_ = 0.1;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<double,opentracing::v3::util::detail::value_traits<double,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_150,(double *)local_2c0);
  local_120[0] = local_110;
  local_128 = &local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"ratelimiting","");
  local_2c0._0_8_ = (char *)0x3fb999999999999a;
  opentracing::v3::util::
  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
  ::
  variant<double,opentracing::v3::util::detail::value_traits<double,bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>,void>
            (&local_100,(double *)local_2c0);
  lVar8 = 0;
  do {
    plVar1 = *(long **)((long)&local_218 + lVar8);
    local_2f8 = (long *)0x0;
    uStack_2f0 = 0;
    local_2e8 = local_2d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"op","");
    (**(code **)(*plVar1 + 0x10))(local_2c0,plVar1,&local_2f8,(string *)&local_2e8);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::vector
              (&local_298,
               (vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_2c0 + 8));
    local_2a0 = lVar8;
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
              ((vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_> *)(local_2c0 + 8));
    if (local_2e8 != local_2d8) {
      operator_delete(local_2e8);
    }
    pTVar2 = local_298.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_2c4 = 0;
    if (local_298.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_298.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      local_280 = (Value *)((long)&local_1f0.type_index + local_2a0);
      local_278 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&local_210._M_dataplus._M_p + local_2a0);
      pTVar7 = local_298.super__Vector_base<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar5 = std::__cxx11::string::compare((char *)pTVar7);
        if (iVar5 == 0) {
          bVar3 = opentracing::v3::util::
                  variant<bool,double,long,unsigned_long,std::__cxx11::string,opentracing::v3::string_view,decltype(nullptr),char_const*,opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,std::allocator<opentracing::v3::Value>>>,opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::string,opentracing::v3::Value,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,opentracing::v3::Value>>>>>
                  ::is<char_const*>(&(pTVar7->_value).super_variant_type);
          local_2e8 = (long *)CONCAT71(local_2e8._1_7_,bVar3);
          local_2e0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (bVar3) {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2e0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          }
          else {
            testing::Message::Message((Message *)&local_2f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((AssertionResult *)local_2c0,(char *)&local_2e8,
                       "tag.value().is<const char*>()","false");
            testing::internal::AssertHelper::AssertHelper
                      (local_270,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x59,(char *)local_2c0._0_8_);
            testing::internal::AssertHelper::operator=(local_270,(Message *)&local_2f8);
            testing::internal::AssertHelper::~AssertHelper(local_270);
            if ((char *)local_2c0._0_8_ != local_2b0) {
              operator_delete((void *)local_2c0._0_8_);
            }
            if (local_2f8 != (long *)0x0) {
              cVar4 = testing::internal::IsTrue(true);
              if ((cVar4 != '\0') && (local_2f8 != (long *)0x0)) {
                (**(code **)(*local_2f8 + 8))();
              }
              local_2f8 = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_2e0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            if (!bVar3) goto LAB_001bc79b;
          }
          rhs = opentracing::v3::util::
                variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
                ::get<const_char_*,_nullptr>(&(pTVar7->_value).super_variant_type);
          testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
                    ((internal *)local_2c0,"test._samplerType","tag.value().get<const char*>()",
                     local_278,rhs);
          if (local_2c0[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_2e8);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((_Alloc_hider *)local_2c0._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_2f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x5a,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_2f8,(Message *)&local_2e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
            if (local_2e8 != (long *)0x0) {
              cVar4 = testing::internal::IsTrue(true);
              if ((cVar4 != '\0') && (local_2e8 != (long *)0x0)) {
                (**(code **)(*local_2e8 + 8))();
              }
              local_2e8 = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_2c0 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001bc79b;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(local_2c0 + 8),
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001bc572:
          local_2c4 = local_2c4 + 1;
        }
        else {
          iVar5 = std::__cxx11::string::compare((char *)pTVar7);
          if (iVar5 == 0) {
            testing::internal::CmpHelperEQ<opentracing::v3::Value,opentracing::v3::Value>
                      ((internal *)local_2c0,"test._samplerParam","tag.value()",local_280,
                       &pTVar7->_value);
            if (local_2c0[0] != (internal)0x0) {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)(local_2c0 + 8),
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              goto LAB_001bc572;
            }
            testing::Message::Message((Message *)&local_2e8);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0._8_8_
                == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar6 = "";
            }
            else {
              pcVar6 = ((_Alloc_hider *)local_2c0._8_8_)->_M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_2f8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                       ,0x5e,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_2f8,(Message *)&local_2e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
            if (local_2e8 != (long *)0x0) {
              cVar4 = testing::internal::IsTrue(true);
              if ((cVar4 != '\0') && (local_2e8 != (long *)0x0)) {
                (**(code **)(*local_2e8 + 8))();
              }
              local_2e8 = (long *)0x0;
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)(local_2c0 + 8),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001bc79b;
          }
        }
        pTVar7 = pTVar7 + 1;
      } while (pTVar7 != pTVar2);
    }
    local_2e8 = (long *)CONCAT44(local_2e8._4_4_,2);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_2c0,"2","count",(int *)&local_2e8,&local_2c4);
    lVar8 = local_2a0;
    if (local_2c0[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_2e8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)local_2c0._8_8_)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_2f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x62,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f8,(Message *)&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f8);
      if (local_2e8 != (long *)0x0) {
        cVar4 = testing::internal::IsTrue(true);
        if ((cVar4 != '\0') && (local_2e8 != (long *)0x0)) {
          (**(code **)(*local_2e8 + 8))();
        }
        local_2e8 = (long *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_2c0 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
LAB_001bc79b:
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_298);
      goto LAB_001bc7a5;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_2c0 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_298);
    lVar8 = lVar8 + 0x50;
    if (lVar8 == 0x140) {
LAB_001bc7a5:
      lVar8 = -0x140;
      this_00 = &local_100;
      do {
        opentracing::v3::util::
        variant<bool,_double,_long,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::string_view,_std::nullptr_t,_const_char_*,_opentracing::v3::util::recursive_wrapper<std::vector<opentracing::v3::Value,_std::allocator<opentracing::v3::Value>_>_>,_opentracing::v3::util::recursive_wrapper<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opentracing::v3::Value>_>_>_>_>
        ::~variant(this_00);
        if ((anon_struct_8_0_00000001_for___align)((long)&this_00[-1].data + 0x10) !=
            this_00[-1].data.__align) {
          operator_delete((void *)this_00[-1].data.__align);
        }
        this_00 = this_00 + -2;
        lVar8 = lVar8 + 0x50;
      } while (lVar8 != 0);
      local_a0.super_Sampler._vptr_Sampler = (_func_int **)&PTR__RateLimitingSampler_00210d18;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_a0._tags)
      ;
      local_d0.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ProbabilisticSampler_00210cc8;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector(&local_d0._tags)
      ;
      local_268.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ConstSampler_00210c68;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&local_268._tags);
      local_240.super_Sampler._vptr_Sampler = (_func_int **)&PTR__ConstSampler_00210c68;
      std::vector<jaegertracing::Tag,_std::allocator<jaegertracing::Tag>_>::~vector
                (&local_240._tags);
      return;
    }
  } while( true );
}

Assistant:

TEST(Sampler, testSamplerTags)
{
    ConstSampler constTrue(true);
    ConstSampler constFalse(false);
    ProbabilisticSampler prob(0.1);
    RateLimitingSampler rate(0.1);

    const struct {
        Sampler& _sampler;
        std::string _samplerType;
        Tag::ValueType _samplerParam;
    } tests[] = { { constTrue, "const", true },
                  { constFalse, "const", false },
                  { prob, "probabilistic", 0.1 },
                  { rate, "ratelimiting", 0.1 } };

    for (auto&& test : tests) {
        const auto tags =
            test._sampler.isSampled(TraceID(), kTestOperationName).tags();
        auto count = 0;
        for (auto&& tag : tags) {
            if (tag.key() == kSamplerTypeTagKey) {
                ASSERT_TRUE(tag.value().is<const char*>());
                ASSERT_EQ(test._samplerType, tag.value().get<const char*>());
                ++count;
            }
            else if (tag.key() == kSamplerParamTagKey) {
                ASSERT_EQ(test._samplerParam, tag.value());
                ++count;
            }
        }
        ASSERT_EQ(2, count);
    }
}